

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApiDebug.cpp
# Opt level: O3

bool __thiscall triangle::contains(triangle *this,vec2 *p,float r)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  float fVar4;
  vec2 local_40;
  float local_38;
  
  bVar1 = contains(this,p);
  bVar2 = true;
  if (!bVar1) {
    uVar3 = 0;
    do {
      fVar4 = ((float)(int)uVar3 * 0.00390625 + (float)(int)uVar3 * 0.00390625) * 3.1415927;
      local_38 = cosf(fVar4);
      fVar4 = sinf(fVar4);
      local_40.y = (*p).y + fVar4 * r;
      local_40.x = (*p).x + local_38 * r;
      bVar2 = contains(this,&local_40);
      if (0xfe < uVar3) {
        return bVar2;
      }
      uVar3 = uVar3 + 1;
    } while (!bVar2);
  }
  return bVar2;
}

Assistant:

bool contains(const dja::vec2 &p, float r) const {
        bool res = contains(p);
        int cnt = 256;

        for (int i = 0; i < cnt && !res; ++i) {
            float u = i / float(cnt);
            float a = u * 2 * M_PI;
            float x = cos(a), y = sin(a);

            res = res || contains(p + r * dja::vec2(x, y));
        }

        return res;
    }